

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O1

void jsoncons::
     encode_traits<std::tuple<std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (value_type *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  undefined **local_30;
  
  local_30 = &PTR__ser_context_00b58eb8;
  (*encoder->_vptr_basic_json_visitor[7])(encoder,3,0,&local_30,ec);
  if (ec->_M_value == 0) {
    detail::
    json_serialize_tuple_helper<3UL,_3UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::encode(val,encoder,proto,ec);
    if (ec->_M_value == 0) {
      local_30 = &PTR__ser_context_00b58eb8;
      (*encoder->_vptr_basic_json_visitor[8])(encoder,&local_30,ec);
    }
  }
  return;
}

Assistant:

static void encode(const value_type& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            using helper = jsoncons::detail::json_serialize_tuple_helper<size, size, Json, std::tuple<E...>>;
            encoder.begin_array(size,semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            helper::encode(val, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encoder.end_array(ser_context(),ec);
        }